

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

bool Js::JavascriptRegExp::HasObservableFlags(DynamicObject *regexPrototype)

{
  JavascriptLibrary *pJVar1;
  JavascriptFunction *pJVar2;
  bool bVar3;
  
  pJVar1 = (((regexPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  if (((((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES6RegExPrototypeProperties == true) {
    pJVar2 = (JavascriptFunction *)
             DynamicObject::GetSlot(regexPrototype,pJVar1->regexFlagsGetterSlotIndex);
    bVar3 = pJVar2 != (pJVar1->regexFlagsGetterFunction).ptr;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool JavascriptRegExp::HasObservableFlags(DynamicObject* regexPrototype)
    {
        JavascriptLibrary* library = regexPrototype->GetLibrary();
        return regexPrototype->GetScriptContext()->GetConfig()->IsES6RegExPrototypePropertiesEnabled()
            && regexPrototype->GetSlot(library->GetRegexFlagsGetterSlotIndex()) != library->GetRegexFlagsGetterFunction();
    }